

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O3

bool __thiscall FScanner::CheckFloat(FScanner *this)

{
  bool bVar1;
  double dVar2;
  char *stopper;
  char *local_20;
  
  bVar1 = ScanString(this,false);
  if (bVar1) {
    if (*this->String != '\0') {
      dVar2 = strtod(this->String,&local_20);
      this->Float = dVar2;
      if (*local_20 == '\0') {
        return true;
      }
    }
    this->AlreadyGot = true;
    this->AlreadyGotLine = this->LastGotLine;
  }
  return false;
}

Assistant:

bool FScanner::CheckFloat ()
{
	char *stopper;

	if (GetString())
	{
		if (String[0] == 0)
		{
			UnGet();
			return false;
		}
	
		Float = strtod (String, &stopper);
		if (*stopper != 0)
		{
			UnGet();
			return false;
		}
		return true;
	}
	else
	{
		return false;
	}
}